

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

DistantLight * __thiscall
embree::SceneGraph::DistantLight::transform
          (DistantLight *__return_storage_ptr__,DistantLight *this,AffineSpace3fa *space)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined8 uVar16;
  float fVar17;
  
  fVar1 = (this->D).field_0.m128[0];
  fVar2 = (this->D).field_0.m128[1];
  fVar3 = (this->D).field_0.m128[2];
  fVar4 = (space->l).vz.field_0.m128[0];
  fVar5 = (space->l).vz.field_0.m128[1];
  fVar6 = (space->l).vz.field_0.m128[2];
  fVar7 = (space->l).vz.field_0.m128[3];
  fVar8 = (space->l).vy.field_0.m128[0];
  fVar9 = (space->l).vy.field_0.m128[1];
  fVar10 = (space->l).vy.field_0.m128[2];
  fVar11 = (space->l).vy.field_0.m128[3];
  fVar12 = (space->l).vx.field_0.m128[0];
  fVar13 = (space->l).vx.field_0.m128[1];
  fVar14 = (space->l).vx.field_0.m128[2];
  fVar15 = (space->l).vx.field_0.m128[3];
  fVar17 = this->halfAngle;
  (__return_storage_ptr__->super_Light).type = LIGHT_DISTANT;
  (__return_storage_ptr__->D).field_0.m128[0] = fVar1 * fVar12 + fVar2 * fVar8 + fVar3 * fVar4;
  (__return_storage_ptr__->D).field_0.m128[1] = fVar1 * fVar13 + fVar2 * fVar9 + fVar3 * fVar5;
  (__return_storage_ptr__->D).field_0.m128[2] = fVar1 * fVar14 + fVar2 * fVar10 + fVar3 * fVar6;
  (__return_storage_ptr__->D).field_0.m128[3] = fVar1 * fVar15 + fVar2 * fVar11 + fVar3 * fVar7;
  uVar16 = *(undefined8 *)((long)&(this->L).field_0 + 8);
  *(undefined8 *)&(__return_storage_ptr__->L).field_0 = *(undefined8 *)&(this->L).field_0;
  *(undefined8 *)((long)&(__return_storage_ptr__->L).field_0 + 8) = uVar16;
  __return_storage_ptr__->halfAngle = fVar17;
  fVar17 = fVar17 * 0.017453292;
  __return_storage_ptr__->radHalfAngle = fVar17;
  fVar17 = cosf(fVar17);
  __return_storage_ptr__->cosHalfAngle = fVar17;
  return __return_storage_ptr__;
}

Assistant:

DistantLight transform(const AffineSpace3fa& space) const {
        return DistantLight(xfmVector(space,D),L,halfAngle);
      }